

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_113ab01::TNoContractionPropagator::visitAggregate
          (TNoContractionPropagator *this,TVisit param_1,TIntermAggregate *node)

{
  ObjectAccessChain *chain;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  long *plVar5;
  long lVar6;
  ObjectAccessChain next_level_accesschain;
  StateSettingGuard<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  setup_remained_accesschain_for_next_level;
  ObjectAccessChain precise_accesschain_index_str;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  string *local_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  ObjectAccessChain local_50;
  
  bVar2 = true;
  if (((this->remained_accesschain_)._M_string_length != 0) &&
     ((node->super_TIntermOperator).op == EOpConstructStruct)) {
    chain = &this->remained_accesschain_;
    getFrontElement(&local_50,chain);
    uVar4 = strtoul(local_50._M_dataplus._M_p,(char **)0x0,10);
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    plVar5 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var,iVar3) + 8) +
                                             (uVar4 & 0xffffffff) * 8) + 0x18))();
    if (plVar5 == (long *)0x0) {
      __assert_fail("potential_precise_node",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x2a9,
                    "virtual bool (anonymous namespace)::TNoContractionPropagator::visitAggregate(glslang::TVisit, glslang::TIntermAggregate *)"
                   );
    }
    lVar6 = std::__cxx11::string::find((char)chain,0x2f);
    if (lVar6 == -1) {
      local_b0 = 0;
      local_a8 = 0;
      local_b8 = &local_a8;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)chain);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,local_b8,local_b8 + local_b0);
    local_90[0] = local_80;
    pcVar1 = (this->remained_accesschain_)._M_dataplus._M_p;
    local_98 = (string *)chain;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + (this->remained_accesschain_)._M_string_length);
    std::__cxx11::string::_M_assign((string *)chain);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    (**(code **)(*plVar5 + 0x10))(plVar5,this);
    std::__cxx11::string::_M_assign(local_98);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool visitAggregate(glslang::TVisit, glslang::TIntermAggregate* node) override
    {
        if (!remained_accesschain_.empty() && node->getOp() == glslang::EOpConstructStruct) {
            // This is a struct initializer node, and the remained
            // access chain is not empty, we need to refer to the
            // assignee_remained_access_chain_ to find the nested
            // 'precise' object. And we don't need to visit other nodes in this
            // aggregate node.

            // Gets the struct dereference index that leads to 'precise' object.
            ObjectAccessChain precise_accesschain_index_str =
                getFrontElement(remained_accesschain_);
            unsigned precise_accesschain_index = (unsigned)strtoul(precise_accesschain_index_str.c_str(), nullptr, 10);
            // Gets the node pointed by the access chain index extracted before.
            glslang::TIntermTyped* potential_precise_node =
                node->getSequence()[precise_accesschain_index]->getAsTyped();
            assert(potential_precise_node);
            // Pop the front access chain index from the path, and visit the nested node.
            {
                ObjectAccessChain next_level_accesschain =
                    subAccessChainFromSecondElement(remained_accesschain_);
                StateSettingGuard<ObjectAccessChain> setup_remained_accesschain_for_next_level(
                    &remained_accesschain_, next_level_accesschain);
                potential_precise_node->traverse(this);
            }
            return false;
        }
        return true;
    }